

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::QuadMeshISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,QuadMeshISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  long lVar1;
  BufferView<embree::Vec3fa> *pBVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  PrimRef *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  size_t sVar12;
  ulong uVar13;
  undefined4 uVar14;
  size_t sVar15;
  unsigned_long uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar22 [64];
  undefined1 auVar24 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar16 = r->_begin;
  auVar23._8_4_ = 0x7f800000;
  auVar23._0_8_ = 0x7f8000007f800000;
  auVar23._12_4_ = 0x7f800000;
  auVar24 = ZEXT1664(auVar23);
  auVar21._8_4_ = 0xff800000;
  auVar21._0_8_ = 0xff800000ff800000;
  auVar21._12_4_ = 0xff800000;
  auVar22 = ZEXT1664(auVar21);
  sVar12 = 0;
  auVar25._8_4_ = 0xddccb9a2;
  auVar25._0_8_ = 0xddccb9a2ddccb9a2;
  auVar25._12_4_ = 0xddccb9a2;
  auVar26._8_4_ = 0x5dccb9a2;
  auVar26._0_8_ = 0x5dccb9a25dccb9a2;
  auVar26._12_4_ = 0x5dccb9a2;
  auVar27 = ZEXT1664(auVar21);
  auVar28 = ZEXT1664(auVar23);
  while( true ) {
    if (r->_end <= uVar16) break;
    lVar1 = *(long *)&(this->super_QuadMesh).super_Geometry.field_0x58;
    pBVar2 = (this->super_QuadMesh).vertices.items;
    lVar19 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar16;
    uVar18 = (ulong)*(uint *)(lVar1 + lVar19);
    uVar3 = (pBVar2->super_RawBufferView).num;
    sVar15 = k;
    if ((((uVar18 < uVar3) && (uVar20 = (ulong)*(uint *)(lVar1 + 4 + lVar19), uVar20 < uVar3)) &&
        (uVar13 = (ulong)*(uint *)(lVar1 + 8 + lVar19), uVar13 < uVar3)) &&
       (uVar17 = (ulong)*(uint *)(lVar1 + 0xc + lVar19), uVar17 < uVar3)) {
      pcVar4 = pBVar2[itime].super_RawBufferView.ptr_ofs;
      sVar5 = pBVar2[itime].super_RawBufferView.stride;
      auVar21 = *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar18);
      auVar23 = vcmpps_avx(auVar21,auVar25,6);
      auVar29 = vcmpps_avx(auVar21,auVar26,1);
      auVar23 = vandps_avx(auVar23,auVar29);
      uVar14 = vmovmskps_avx(auVar23);
      if ((~(byte)uVar14 & 7) == 0) {
        auVar23 = *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar20);
        auVar29 = vcmpps_avx(auVar23,auVar25,6);
        auVar7 = vcmpps_avx(auVar23,auVar26,1);
        auVar29 = vandps_avx(auVar29,auVar7);
        uVar14 = vmovmskps_avx(auVar29);
        if ((~(byte)uVar14 & 7) == 0) {
          auVar29 = *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar13);
          auVar7 = vcmpps_avx(auVar29,auVar25,6);
          auVar8 = vcmpps_avx(auVar29,auVar26,1);
          auVar7 = vandps_avx(auVar7,auVar8);
          uVar14 = vmovmskps_avx(auVar7);
          if ((~(byte)uVar14 & 7) == 0) {
            auVar7 = *(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17);
            auVar8 = vcmpps_avx(auVar7,auVar25,6);
            auVar9 = vcmpps_avx(auVar7,auVar26,1);
            auVar8 = vandps_avx(auVar8,auVar9);
            uVar14 = vmovmskps_avx(auVar8);
            if ((~(byte)uVar14 & 7) == 0) {
              pcVar4 = pBVar2[itime + 1].super_RawBufferView.ptr_ofs;
              sVar5 = pBVar2[itime + 1].super_RawBufferView.stride;
              auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar18 * sVar5),auVar25,6);
              auVar9 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar18 * sVar5),auVar26,1);
              auVar8 = vandps_avx(auVar8,auVar9);
              uVar14 = vmovmskps_avx(auVar8);
              if ((~(byte)uVar14 & 7) == 0) {
                auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar20 * sVar5),auVar25,6);
                auVar9 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar20 * sVar5),auVar26,1);
                auVar8 = vandps_avx(auVar8,auVar9);
                uVar14 = vmovmskps_avx(auVar8);
                if ((~(byte)uVar14 & 7) == 0) {
                  auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar13 * sVar5),auVar25,6);
                  auVar9 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + uVar13 * sVar5),auVar26,1);
                  auVar8 = vandps_avx(auVar8,auVar9);
                  uVar14 = vmovmskps_avx(auVar8);
                  if ((~(byte)uVar14 & 7) == 0) {
                    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),auVar25,6);
                    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar5 * uVar17),auVar26,1);
                    auVar8 = vandps_avx(auVar8,auVar9);
                    uVar14 = vmovmskps_avx(auVar8);
                    if ((~(byte)uVar14 & 7) == 0) {
                      auVar8 = vminps_avx(auVar21,auVar23);
                      auVar9 = vminps_avx(auVar29,auVar7);
                      auVar8 = vminps_avx(auVar8,auVar9);
                      aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                )vinsertps_avx(auVar8,ZEXT416(geomID),0x30);
                      auVar21 = vmaxps_avx(auVar21,auVar23);
                      auVar23 = vmaxps_avx(auVar29,auVar7);
                      auVar21 = vmaxps_avx(auVar21,auVar23);
                      aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                )vinsertps_avx(auVar21,ZEXT416((uint)uVar16),0x30);
                      auVar21 = vminps_avx((undefined1  [16])auVar28._0_16_,(undefined1  [16])aVar10
                                          );
                      auVar28 = ZEXT1664(auVar21);
                      auVar21 = vmaxps_avx((undefined1  [16])auVar27._0_16_,(undefined1  [16])aVar11
                                          );
                      auVar27 = ZEXT1664(auVar21);
                      auVar29._0_4_ = aVar10.x + aVar11.x;
                      auVar29._4_4_ = aVar10.y + aVar11.y;
                      auVar29._8_4_ = aVar10.z + aVar11.z;
                      auVar29._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
                      auVar21 = vminps_avx((undefined1  [16])auVar24._0_16_,auVar29);
                      auVar24 = ZEXT1664(auVar21);
                      auVar21 = vmaxps_avx((undefined1  [16])auVar22._0_16_,auVar29);
                      auVar22 = ZEXT1664(auVar21);
                      sVar12 = sVar12 + 1;
                      sVar15 = k + 1;
                      pPVar6 = prims->items;
                      pPVar6[k].lower.field_0.field_1 = aVar10;
                      pPVar6[k].upper.field_0.field_1 = aVar11;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar16 = uVar16 + 1;
    k = sVar15;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       auVar28._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       auVar27._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       auVar24._0_16_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       auVar22._0_16_;
  __return_storage_ptr__->end = sVar12;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }